

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
r_comp::Preprocessor::instantiateClass
          (Preprocessor *this,Ptr *tpl_class,
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          *tpl_args,string *instantiated_class_name)

{
  pointer *__s;
  uint16_t uVar1;
  bool bVar2;
  element_type *peVar3;
  reference psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  mapped_type *this_01;
  Class *pCVar5;
  Class *this_02;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_278;
  string local_260 [36];
  Atom local_23c [4];
  Class local_238;
  shared_ptr<r_comp::RepliStruct> local_1f0;
  undefined1 local_1e0 [8];
  Ptr replistruct;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  *__range1;
  list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  _tpl_args;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> members;
  char buffer [255];
  string local_80 [55];
  allocator local_49;
  string local_48 [8];
  string sset;
  string *instantiated_class_name_local;
  vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  *tpl_args_local;
  Ptr *tpl_class_local;
  Preprocessor *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"[]",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  peVar3 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)tpl_class);
  std::__cxx11::string::operator=((string *)instantiated_class_name,(string *)&peVar3->cmd);
  std::__cxx11::string::length();
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_80,(ulong)instantiated_class_name);
  std::__cxx11::string::operator=((string *)instantiated_class_name,local_80);
  std::__cxx11::string::~string(local_80);
  instantiateClass::LastClassID = instantiateClass::LastClassID + 1;
  __s = &members.
         super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  sprintf((char *)__s,"%lu");
  std::__cxx11::string::operator+=((string *)instantiated_class_name,(char *)__s);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
            ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
             &_tpl_args.
              super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
              ._M_impl._M_node._M_size);
  std::__cxx11::
  list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  ::list((list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          *)&__range1);
  __end1 = std::
           vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ::begin(tpl_args);
  replistruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
         ::end(tpl_args);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                                *)&replistruct.
                                   super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
    if (!bVar2) break;
    psVar4 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr
              ((shared_ptr<r_comp::RepliStruct> *)local_1e0,psVar4);
    std::__cxx11::
    list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
    ::push_back((list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                 *)&__range1,(shared_ptr<r_comp::RepliStruct> *)local_1e0);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr((shared_ptr<r_comp::RepliStruct> *)local_1e0);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
    ::operator++(&__end1);
  }
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_1f0,tpl_class);
  getMembers(this,&local_1f0,
             (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
             &_tpl_args.
              super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
              ._M_impl._M_node._M_size,
             (list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
              *)&__range1,true);
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_1f0);
  this_00 = r_code::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator[](&this->m_metadata->class_names,(ulong)this->m_classOpcode);
  std::__cxx11::string::operator=((string *)this_00,(string *)instantiated_class_name);
  uVar1 = this->m_classOpcode;
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::size
            ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
             &_tpl_args.
              super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
              ._M_impl._M_node._M_size);
  r_code::Atom::SSet((ushort)local_23c,(uchar)uVar1);
  std::__cxx11::string::string(local_260,(string *)instantiated_class_name);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
            (&local_278,
             (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
             &_tpl_args.
              super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
              ._M_impl._M_node._M_size);
  Class::Class(&local_238,local_23c,(string *)local_260,&local_278,ANY);
  this_01 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
            ::operator[](&this->m_metadata->classes,instantiated_class_name);
  pCVar5 = Class::operator=(this_01,&local_238);
  this_02 = r_code::vector<r_comp::Class>::operator[]
                      (&this->m_metadata->classes_by_opcodes,(ulong)this->m_classOpcode);
  Class::operator=(this_02,pCVar5);
  Class::~Class(&local_238);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_278);
  std::__cxx11::string::~string(local_260);
  r_code::Atom::~Atom(local_23c);
  this->m_classOpcode = this->m_classOpcode + 1;
  std::__cxx11::
  list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  ::~list((list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           *)&__range1);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
             &_tpl_args.
              super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
              ._M_impl._M_node._M_size);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void Preprocessor::instantiateClass(RepliStruct::Ptr tpl_class, std::vector<RepliStruct::Ptr> &tpl_args, std::string &instantiated_class_name)
{
    static uint64_t LastClassID = 0;
    // remove the trailing [].
    std::string sset = "[]";
    instantiated_class_name = tpl_class->cmd;
    instantiated_class_name = instantiated_class_name.substr(0, instantiated_class_name.length() - sset.length());
    // append an ID to the tpl class name.
    char buffer[255];
    sprintf(buffer, "%lu", LastClassID++);
    instantiated_class_name += buffer;
    std::vector<StructureMember> members;
    std::list<RepliStruct::Ptr> _tpl_args;

    for (RepliStruct::Ptr replistruct : tpl_args) {
        _tpl_args.push_back(replistruct);
    }

    getMembers(tpl_class, members, _tpl_args, true);
    m_metadata->class_names[m_classOpcode] = instantiated_class_name;
    m_metadata->classes_by_opcodes[m_classOpcode] = m_metadata->classes[instantiated_class_name] = Class(Atom::SSet(m_classOpcode, members.size()), instantiated_class_name, members);
    ++m_classOpcode;
}